

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O0

void trim(string *s)

{
  string *s_local;
  
  trim(s);
  return;
}

Assistant:

static inline void trim(std::string* s)
{
    trim(*s);
}